

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O1

pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
* __thiscall
magic_enum::containers::set<Color,_std::less<Color>_>::insert
          (pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
           *__return_storage_ptr__,set<Color,_std::less<Color>_> *this,value_type *value)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>
  local_48;
  
  pcVar6 = "_EE";
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    pcVar6 = pcVar6 + 4;
    if (2 < uVar4) break;
    uVar2 = uVar4 + 1;
  } while (1 << ((byte)uVar4 & 0x1f) != *value);
  if (uVar4 < 3) {
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      if (2 < uVar5) break;
      uVar2 = uVar5 + 1;
    } while (1 << ((byte)uVar5 & 0x1f) != *value);
    if (2 < uVar5) {
      __assert_fail("(i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/include/magic_enum/magic_enum_containers.hpp"
                    ,0x289,
                    "reference magic_enum::containers::bitset<Color>::operator[](E) [E = Color, Index = magic_enum::containers::detail::indexing<Color>]"
                   );
    }
    bVar3 = '\x01' << ((char)(uVar5 + 1) - 1U & 0x1f);
    bVar1 = (this->a).a._M_elems[0];
    bVar7 = (bVar1 & bVar3) == 0;
    if (bVar7) {
      (this->a).a._M_elems[0] = bVar1 | bVar3;
      this->s = this->s + 1;
    }
    detail::
    FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>
    ::FilteredIterator(&local_48,this,
                       &magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>,
                       &magic_enum::detail::enum_name_v<Color,(Color)1>,pcVar6);
    *(undefined8 *)&(__return_storage_ptr__->first).field_0x20 = local_48._32_8_;
    (__return_storage_ptr__->first).last = local_48.last;
    (__return_storage_ptr__->first).current = local_48.current;
    (__return_storage_ptr__->first).parent = local_48.parent;
    (__return_storage_ptr__->first).first = local_48.first;
    __return_storage_ptr__->second = bVar7;
    if (uVar4 < 3) {
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->first).parent = this;
  (__return_storage_ptr__->first).first =
       &magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>;
  (__return_storage_ptr__->first).last = &magic_enum::detail::enum_name_v<Color,(Color)1>;
  (__return_storage_ptr__->first).current = &magic_enum::detail::enum_name_v<Color,(Color)1>;
  __return_storage_ptr__->second = false;
  return __return_storage_ptr__;
}

Assistant:

constexpr std::pair<iterator, bool> insert(const value_type& value) noexcept {
    if (auto i = index_type::at(value)) {
      typename container_type::reference ref = a[value];
      bool r = !ref;
      if (r) {
        ref = true;
        ++s;
      }

      return {iterator{this, index_type::begin(), index_type::end(), index_type::it(*i)}, r};
    }
    return {end(), false};
  }